

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

Cluster * __thiscall mkvparser::Segment::FindOrPreloadCluster(Segment *this,longlong requested_pos)

{
  Cluster **ppCVar1;
  Cluster **ppCVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  longlong lVar5;
  Cluster *pCVar6;
  Cluster **ppCVar7;
  Cluster **ppCVar8;
  long lVar9;
  
  if (requested_pos < 0) {
LAB_00114ac2:
    pCVar6 = (Cluster *)0x0;
  }
  else {
    ppCVar7 = this->m_clusters;
    ppCVar1 = ppCVar7 + this->m_clusterCount + this->m_clusterPreloadCount;
    ppCVar8 = ppCVar1;
    do {
      while( true ) {
        if (ppCVar8 <= ppCVar7) {
          if (ppCVar7 != ppCVar8) {
            __assert_fail("i == j",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x8c4,
                          "const Cluster *mkvparser::Segment::FindOrPreloadCluster(long long)");
          }
          pCVar6 = Cluster::Create(this,-1,requested_pos);
          if (pCVar6 != (Cluster *)0x0) {
            lVar9 = (long)ppCVar8 - (long)this->m_clusters;
            bVar4 = PreloadCluster(this,pCVar6,lVar9 >> 3);
            if (bVar4) {
              if (this->m_clusters == (Cluster **)0x0) {
                __assert_fail("m_clusters",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                              ,0x8d1,
                              "const Cluster *mkvparser::Segment::FindOrPreloadCluster(long long)");
              }
              if (0 < this->m_clusterPreloadCount) {
                if (*(Cluster **)((long)this->m_clusters + lVar9) == pCVar6) {
                  return pCVar6;
                }
                __assert_fail("m_clusters[idx] == pCluster",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                              ,0x8d3,
                              "const Cluster *mkvparser::Segment::FindOrPreloadCluster(long long)");
              }
              __assert_fail("m_clusterPreloadCount > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x8d2,
                            "const Cluster *mkvparser::Segment::FindOrPreloadCluster(long long)");
            }
            Cluster::~Cluster(pCVar6);
            operator_delete(pCVar6);
          }
          goto LAB_00114ac2;
        }
        auVar3._8_8_ = (long)ppCVar8 - (long)ppCVar7 >> 0x3f;
        auVar3._0_8_ = (long)ppCVar8 - (long)ppCVar7 >> 3;
        ppCVar2 = ppCVar7 + SUB168(auVar3 / SEXT816(2),0);
        if (ppCVar1 <= ppCVar2) {
          __assert_fail("k < jj",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x8b0,"const Cluster *mkvparser::Segment::FindOrPreloadCluster(long long)")
          ;
        }
        pCVar6 = *ppCVar2;
        if (pCVar6 == (Cluster *)0x0) {
          __assert_fail("pCluster",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x8b3,"const Cluster *mkvparser::Segment::FindOrPreloadCluster(long long)")
          ;
        }
        lVar5 = Cluster::GetPosition(pCVar6);
        if (requested_pos <= lVar5) break;
        ppCVar7 = ppCVar2 + 1;
      }
      ppCVar8 = ppCVar2;
    } while (requested_pos < lVar5);
  }
  return pCVar6;
}

Assistant:

const Cluster* Segment::FindOrPreloadCluster(long long requested_pos) {
  if (requested_pos < 0)
    return 0;

  Cluster** const ii = m_clusters;
  Cluster** i = ii;

  const long count = m_clusterCount + m_clusterPreloadCount;

  Cluster** const jj = ii + count;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[ii, i) < pTP->m_pos
    //[i, j) ?
    //[j, jj)  > pTP->m_pos

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    Cluster* const pCluster = *k;
    assert(pCluster);

    // const long long pos_ = pCluster->m_pos;
    // assert(pos_);
    // const long long pos = pos_ * ((pos_ < 0) ? -1 : 1);

    const long long pos = pCluster->GetPosition();
    assert(pos >= 0);

    if (pos < requested_pos)
      i = k + 1;
    else if (pos > requested_pos)
      j = k;
    else
      return pCluster;
  }

  assert(i == j);
  // assert(Cluster::HasBlockEntries(this, tp.m_pos));

  Cluster* const pCluster = Cluster::Create(this, -1, requested_pos);
  if (pCluster == NULL)
    return NULL;

  const ptrdiff_t idx = i - m_clusters;

  if (!PreloadCluster(pCluster, idx)) {
    delete pCluster;
    return NULL;
  }
  assert(m_clusters);
  assert(m_clusterPreloadCount > 0);
  assert(m_clusters[idx] == pCluster);

  return pCluster;
}